

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txpackage_tests.cpp
# Opt level: O0

void __thiscall
txpackage_tests::package_sanitization_tests::test_method(package_sanitization_tests *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 require_sorted;
  int32_t iVar3;
  lazy_ostream *state;
  long in_FS_OFFSET;
  int i_1;
  size_t total_weight;
  int32_t size_large;
  size_t i;
  Package package_with_dup_tx;
  CMutableTransaction dup_tx;
  Package package_conflicts;
  CMutableTransaction tx_zero_2;
  CMutableTransaction tx_zero_1;
  CMutableTransaction empty_tx;
  Package package_duplicate_txids_empty;
  Package package_too_large;
  CTransactionRef large_ptx;
  Package package_too_many;
  COutPoint rand_prevout;
  PackageValidationState state_conflicts;
  COutPoint same_prevout;
  PackageValidationState state_duplicates;
  PackageValidationState state_too_large;
  PackageValidationState state_too_many;
  char *in_stack_fffffffffffff118;
  char *in_stack_fffffffffffff120;
  char *in_stack_fffffffffffff128;
  COutPoint *in_stack_fffffffffffff130;
  vector<CTxIn,_std::allocator<CTxIn>_> *in_stack_fffffffffffff138;
  const_string *in_stack_fffffffffffff140;
  RandomMixin<FastRandomContext> *in_stack_fffffffffffff148;
  const_string *in_stack_fffffffffffff150;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_fffffffffffff158;
  initializer_list<std::shared_ptr<const_CTransaction>_> in_stack_fffffffffffff160;
  Package *in_stack_fffffffffffff190;
  undefined7 in_stack_fffffffffffff198;
  undefined1 in_stack_fffffffffffff19f;
  size_t in_stack_fffffffffffff1a0;
  undefined7 in_stack_fffffffffffff1a8;
  undefined1 in_stack_fffffffffffff1af;
  Package *in_stack_fffffffffffff1c8;
  Package *local_e28;
  undefined1 in_stack_fffffffffffff267;
  PackageValidationState *in_stack_fffffffffffff268;
  undefined7 in_stack_fffffffffffff270;
  undefined1 in_stack_fffffffffffff277;
  undefined1 *local_d70;
  int local_be0;
  ulong local_bd8;
  ulong local_bc8;
  const_string local_ba8 [2];
  lazy_ostream local_b88 [2];
  assertion_result local_b68 [3];
  const_string local_b20 [2];
  lazy_ostream local_b00 [2];
  assertion_result local_ae0 [6];
  undefined1 local_a50 [16];
  undefined1 local_a40 [64];
  ValidationState<PackageValidationResult> local_a00;
  const_string local_9a8 [2];
  lazy_ostream local_988 [2];
  assertion_result local_968 [2];
  const_string local_930 [2];
  lazy_ostream local_910 [2];
  assertion_result local_8f0 [2];
  const_string local_8b8 [2];
  lazy_ostream local_898 [2];
  assertion_result local_878 [3];
  undefined8 local_820;
  const_string local_7a8 [2];
  lazy_ostream local_788 [2];
  assertion_result local_768 [2];
  undefined1 local_730 [16];
  undefined1 local_720 [64];
  ValidationState<PackageValidationResult> local_6e0;
  const_string local_688 [2];
  lazy_ostream local_668 [2];
  assertion_result local_648 [6];
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [64];
  ValidationState<PackageValidationResult> local_560;
  const_string local_508 [2];
  lazy_ostream local_4e8 [2];
  assertion_result local_4c8 [2];
  const_string local_490 [2];
  lazy_ostream local_470 [2];
  assertion_result local_450 [4];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [64];
  ValidationState<PackageValidationResult> local_3a0;
  const_string local_348 [2];
  lazy_ostream local_328 [2];
  assertion_result local_308 [4];
  undefined1 local_2a8 [120];
  undefined1 local_230 [104];
  undefined1 local_1c8 [32];
  undefined1 auStack_1a8 [104];
  undefined1 local_140 [104];
  undefined1 local_d8 [104];
  undefined1 local_70 [104];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_fffffffffffff118);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::reserve(in_stack_fffffffffffff158,(size_type)in_stack_fffffffffffff150);
  for (local_bc8 = 0; local_bc8 < 0x1a; local_bc8 = local_bc8 + 1) {
    TxPackageTest::create_placeholder_tx
              ((TxPackageTest *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8),
               in_stack_fffffffffffff1a0,
               CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198));
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffff138,
               (shared_ptr<const_CTransaction> *)in_stack_fffffffffffff130);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff118);
  }
  PackageValidationState::PackageValidationState
            ((PackageValidationState *)in_stack_fffffffffffff118);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    IsWellFormedPackage((Package *)CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                        in_stack_fffffffffffff268,(bool)in_stack_fffffffffffff267);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff128,
               SUB81((ulong)in_stack_fffffffffffff120 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,
               (basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    in_stack_fffffffffffff118 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_308,local_328,local_348,0x8e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff118);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,(char (*) [1])in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    local_3a0.m_result =
         ValidationState<PackageValidationResult>::GetResult
                   ((ValidationState<PackageValidationResult> *)in_stack_fffffffffffff118);
    local_3a0.m_mode = M_INVALID;
    in_stack_fffffffffffff128 = "PackageValidationResult::PCKG_POLICY";
    in_stack_fffffffffffff120 = (char *)&local_3a0;
    in_stack_fffffffffffff118 = "state_too_many.GetResult()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
              (&local_3a0.m_reject_reason.field_2,&local_3a0.m_reject_reason,0x8f,1,2,
               &local_3a0.m_result);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,(char (*) [1])in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    ValidationState<PackageValidationResult>::GetRejectReason_abi_cxx11_
              ((ValidationState<PackageValidationResult> *)in_stack_fffffffffffff120);
    in_stack_fffffffffffff128 = "\"package-too-many-transactions\"";
    in_stack_fffffffffffff120 = "package-too-many-transactions";
    in_stack_fffffffffffff118 = "state_too_many.GetRejectReason()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[30]>
              (local_3e0,local_3f0,0x90,1,2,local_70);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff118);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TxPackageTest::create_placeholder_tx
            ((TxPackageTest *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8),
             in_stack_fffffffffffff1a0,CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198)
            );
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_fffffffffffff118);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffff128);
  iVar3 = GetTransactionWeight((CTransaction *)in_stack_fffffffffffff118);
  for (local_bd8 = 0; local_bd8 < 0x62a21; local_bd8 = (long)iVar3 + local_bd8) {
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)in_stack_fffffffffffff128,(value_type *)in_stack_fffffffffffff120);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::size((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_fffffffffffff118);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff128,
               SUB81((ulong)in_stack_fffffffffffff120 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,
               (basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    in_stack_fffffffffffff118 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_450,local_470,local_490,0x9b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff118);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  PackageValidationState::PackageValidationState
            ((PackageValidationState *)in_stack_fffffffffffff118);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    IsWellFormedPackage((Package *)CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                        in_stack_fffffffffffff268,(bool)in_stack_fffffffffffff267);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff128,
               SUB81((ulong)in_stack_fffffffffffff120 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,
               (basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    in_stack_fffffffffffff118 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4c8,local_4e8,local_508,0x9d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff118);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,(char (*) [1])in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    local_560.m_result =
         ValidationState<PackageValidationResult>::GetResult
                   ((ValidationState<PackageValidationResult> *)in_stack_fffffffffffff118);
    local_560.m_mode = M_INVALID;
    in_stack_fffffffffffff128 = "PackageValidationResult::PCKG_POLICY";
    in_stack_fffffffffffff120 = (char *)&local_560;
    in_stack_fffffffffffff118 = "state_too_large.GetResult()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
              (&local_560.m_reject_reason.field_2,&local_560.m_reject_reason,0x9e,1,2,
               &local_560.m_result);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,(char (*) [1])in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    ValidationState<PackageValidationResult>::GetRejectReason_abi_cxx11_
              ((ValidationState<PackageValidationResult> *)in_stack_fffffffffffff120);
    in_stack_fffffffffffff128 = "\"package-too-large\"";
    in_stack_fffffffffffff120 = "package-too-large";
    in_stack_fffffffffffff118 = "state_too_large.GetRejectReason()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[18]>
              (local_5a0,local_5b0,0x9f,1,2,local_d8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff118);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_fffffffffffff118);
  for (local_be0 = 0; local_be0 < 3; local_be0 = local_be0 + 1) {
    CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff118);
    MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)in_stack_fffffffffffff120);
    std::
    vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
    ::emplace_back<std::shared_ptr<CTransaction_const>>
              ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_fffffffffffff138,
               (shared_ptr<const_CTransaction> *)in_stack_fffffffffffff130);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff118);
    CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff118);
  }
  PackageValidationState::PackageValidationState
            ((PackageValidationState *)in_stack_fffffffffffff118);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    IsWellFormedPackage((Package *)CONCAT17(in_stack_fffffffffffff277,in_stack_fffffffffffff270),
                        in_stack_fffffffffffff268,(bool)in_stack_fffffffffffff267);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff128,
               SUB81((ulong)in_stack_fffffffffffff120 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,
               (basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    in_stack_fffffffffffff118 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_648,local_668,local_688,0xa8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff118);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,(char (*) [1])in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    local_6e0.m_result =
         ValidationState<PackageValidationResult>::GetResult
                   ((ValidationState<PackageValidationResult> *)in_stack_fffffffffffff118);
    local_6e0.m_mode = M_INVALID;
    in_stack_fffffffffffff128 = "PackageValidationResult::PCKG_POLICY";
    in_stack_fffffffffffff120 = (char *)&local_6e0;
    in_stack_fffffffffffff118 = "state_duplicates.GetResult()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
              (&local_6e0.m_reject_reason.field_2,&local_6e0.m_reject_reason,0xa9,1,2,
               &local_6e0.m_result);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,(char (*) [1])in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    ValidationState<PackageValidationResult>::GetRejectReason_abi_cxx11_
              ((ValidationState<PackageValidationResult> *)in_stack_fffffffffffff120);
    in_stack_fffffffffffff128 = "\"package-contains-duplicates\"";
    in_stack_fffffffffffff120 = "package-contains-duplicates";
    in_stack_fffffffffffff118 = "state_duplicates.GetRejectReason()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[28]>
              (local_720,local_730,0xaa,1,2,local_140);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff118);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    IsConsistentPackage(in_stack_fffffffffffff1c8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff128,
               SUB81((ulong)in_stack_fffffffffffff120 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,
               (basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    in_stack_fffffffffffff118 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_768,local_788,local_7a8,0xab,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff118);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff118);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff118);
  RandomMixin<FastRandomContext>::rand256(in_stack_fffffffffffff148);
  transaction_identifier<false>::FromUint256((uint256 *)in_stack_fffffffffffff118);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_fffffffffffff128,(Txid *)in_stack_fffffffffffff120,
             (uint32_t)((ulong)in_stack_fffffffffffff118 >> 0x20));
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint&>
            (in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint&>
            (in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long_const&,CScript_const&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff138,
             (long *)in_stack_fffffffffffff130,(CScript *)in_stack_fffffffffffff128);
  local_820 = 2000000;
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<long,CScript_const&>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff138,
             (long *)in_stack_fffffffffffff130,(CScript *)in_stack_fffffffffffff128);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)in_stack_fffffffffffff120);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)in_stack_fffffffffffff120);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_fffffffffffff118);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_fffffffffffff158,in_stack_fffffffffffff160,
           (allocator_type *)in_stack_fffffffffffff150);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_fffffffffffff118);
  local_d70 = auStack_1a8;
  do {
    local_d70 = local_d70 + -0x10;
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff118);
  } while (local_d70 != local_1c8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    uVar2 = IsConsistentPackage(in_stack_fffffffffffff1c8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff128,
               SUB81((ulong)in_stack_fffffffffffff120 >> 0x38,0));
    state = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,
               (basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    in_stack_fffffffffffff118 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_878,local_898,local_8b8,0xb7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff118);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff118);
    require_sorted = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)require_sorted);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    IsTopoSortedPackage(in_stack_fffffffffffff190);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff128,
               SUB81((ulong)in_stack_fffffffffffff120 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,
               (basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    in_stack_fffffffffffff118 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8f0,local_910,local_930,0xb9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff118);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  PackageValidationState::PackageValidationState
            ((PackageValidationState *)in_stack_fffffffffffff118);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    IsWellFormedPackage((Package *)CONCAT17(uVar2,in_stack_fffffffffffff270),
                        (PackageValidationState *)state,(bool)require_sorted);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff128,
               SUB81((ulong)in_stack_fffffffffffff120 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,
               (basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    in_stack_fffffffffffff118 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_968,local_988,local_9a8,0xbb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff118);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,(char (*) [1])in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    local_a00.m_result =
         ValidationState<PackageValidationResult>::GetResult
                   ((ValidationState<PackageValidationResult> *)in_stack_fffffffffffff118);
    local_a00.m_mode = M_INVALID;
    in_stack_fffffffffffff128 = "PackageValidationResult::PCKG_POLICY";
    in_stack_fffffffffffff120 = (char *)&local_a00;
    in_stack_fffffffffffff118 = "state_conflicts.GetResult()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,PackageValidationResult,PackageValidationResult>
              (&local_a00.m_reject_reason.field_2,&local_a00.m_reject_reason,0xbc,1,2,
               &local_a00.m_result);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,(char (*) [1])in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    ValidationState<PackageValidationResult>::GetRejectReason_abi_cxx11_
              ((ValidationState<PackageValidationResult> *)in_stack_fffffffffffff120);
    in_stack_fffffffffffff128 = "\"conflict-in-package\"";
    in_stack_fffffffffffff120 = "conflict-in-package";
    in_stack_fffffffffffff118 = "state_conflicts.GetRejectReason()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[20]>
              (local_a40,local_a50,0xbd,1,2,local_230);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff118);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff118);
  RandomMixin<FastRandomContext>::rand256(in_stack_fffffffffffff148);
  transaction_identifier<false>::FromUint256((uint256 *)in_stack_fffffffffffff118);
  COutPoint::COutPoint
            ((COutPoint *)in_stack_fffffffffffff128,(Txid *)in_stack_fffffffffffff120,
             (uint32_t)((ulong)in_stack_fffffffffffff118 >> 0x20));
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint_const&>
            (in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  std::vector<CTxIn,std::allocator<CTxIn>>::emplace_back<COutPoint_const&>
            (in_stack_fffffffffffff138,in_stack_fffffffffffff130);
  MakeTransactionRef<CMutableTransaction&>((CMutableTransaction *)in_stack_fffffffffffff120);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_fffffffffffff118);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector(in_stack_fffffffffffff158,in_stack_fffffffffffff160,
           (allocator_type *)in_stack_fffffffffffff150);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_fffffffffffff118);
  local_e28 = (Package *)(local_2a8 + 0x10);
  do {
    local_e28 = (Package *)
                &local_e28[-1].
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff118);
  } while (local_e28 != (Package *)local_2a8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    IsConsistentPackage(local_e28);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff128,
               SUB81((ulong)in_stack_fffffffffffff120 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,
               (basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    in_stack_fffffffffffff118 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ae0,local_b00,local_b20,0xc6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff118);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  TxPackageTest::create_placeholder_tx
            ((TxPackageTest *)CONCAT17(bVar1,in_stack_fffffffffffff1a8),in_stack_fffffffffffff1a0,
             CONCAT17(in_stack_fffffffffffff19f,in_stack_fffffffffffff198));
  std::
  vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>::
  emplace_back<std::shared_ptr<CTransaction_const>>
            ((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_fffffffffffff138,
             (shared_ptr<const_CTransaction> *)in_stack_fffffffffffff130);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff118);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff158,in_stack_fffffffffffff150,
               (size_t)in_stack_fffffffffffff148,in_stack_fffffffffffff140);
    IsConsistentPackage(local_e28);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff128,
               SUB81((ulong)in_stack_fffffffffffff120 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff120,
               (basic_cstring<const_char> *)in_stack_fffffffffffff118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128,in_stack_fffffffffffff120,
               (unsigned_long)in_stack_fffffffffffff118);
    in_stack_fffffffffffff118 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b68,local_b88,local_ba8,200,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff118);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff118);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_fffffffffffff128);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff118);
  PackageValidationState::~PackageValidationState
            ((PackageValidationState *)in_stack_fffffffffffff118);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_fffffffffffff128);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff118);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff118);
  PackageValidationState::~PackageValidationState
            ((PackageValidationState *)in_stack_fffffffffffff118);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_fffffffffffff128);
  PackageValidationState::~PackageValidationState
            ((PackageValidationState *)in_stack_fffffffffffff118);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_fffffffffffff128);
  std::shared_ptr<const_CTransaction>::~shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffff118);
  PackageValidationState::~PackageValidationState
            ((PackageValidationState *)in_stack_fffffffffffff118);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_fffffffffffff128);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(package_sanitization_tests)
{
    // Packages can't have more than 25 transactions.
    Package package_too_many;
    package_too_many.reserve(MAX_PACKAGE_COUNT + 1);
    for (size_t i{0}; i < MAX_PACKAGE_COUNT + 1; ++i) {
        package_too_many.emplace_back(create_placeholder_tx(1, 1));
    }
    PackageValidationState state_too_many;
    BOOST_CHECK(!IsWellFormedPackage(package_too_many, state_too_many, /*require_sorted=*/true));
    BOOST_CHECK_EQUAL(state_too_many.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(state_too_many.GetRejectReason(), "package-too-many-transactions");

    // Packages can't have a total weight of more than 404'000WU.
    CTransactionRef large_ptx = create_placeholder_tx(150, 150);
    Package package_too_large;
    auto size_large = GetTransactionWeight(*large_ptx);
    size_t total_weight{0};
    while (total_weight <= MAX_PACKAGE_WEIGHT) {
        package_too_large.push_back(large_ptx);
        total_weight += size_large;
    }
    BOOST_CHECK(package_too_large.size() <= MAX_PACKAGE_COUNT);
    PackageValidationState state_too_large;
    BOOST_CHECK(!IsWellFormedPackage(package_too_large, state_too_large, /*require_sorted=*/true));
    BOOST_CHECK_EQUAL(state_too_large.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(state_too_large.GetRejectReason(), "package-too-large");

    // Packages can't contain transactions with the same txid.
    Package package_duplicate_txids_empty;
    for (auto i{0}; i < 3; ++i) {
        CMutableTransaction empty_tx;
        package_duplicate_txids_empty.emplace_back(MakeTransactionRef(empty_tx));
    }
    PackageValidationState state_duplicates;
    BOOST_CHECK(!IsWellFormedPackage(package_duplicate_txids_empty, state_duplicates, /*require_sorted=*/true));
    BOOST_CHECK_EQUAL(state_duplicates.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(state_duplicates.GetRejectReason(), "package-contains-duplicates");
    BOOST_CHECK(!IsConsistentPackage(package_duplicate_txids_empty));

    // Packages can't have transactions spending the same prevout
    CMutableTransaction tx_zero_1;
    CMutableTransaction tx_zero_2;
    COutPoint same_prevout{Txid::FromUint256(m_rng.rand256()), 0};
    tx_zero_1.vin.emplace_back(same_prevout);
    tx_zero_2.vin.emplace_back(same_prevout);
    // Different vouts (not the same tx)
    tx_zero_1.vout.emplace_back(CENT, P2WSH_OP_TRUE);
    tx_zero_2.vout.emplace_back(2 * CENT, P2WSH_OP_TRUE);
    Package package_conflicts{MakeTransactionRef(tx_zero_1), MakeTransactionRef(tx_zero_2)};
    BOOST_CHECK(!IsConsistentPackage(package_conflicts));
    // Transactions are considered sorted when they have no dependencies.
    BOOST_CHECK(IsTopoSortedPackage(package_conflicts));
    PackageValidationState state_conflicts;
    BOOST_CHECK(!IsWellFormedPackage(package_conflicts, state_conflicts, /*require_sorted=*/true));
    BOOST_CHECK_EQUAL(state_conflicts.GetResult(), PackageValidationResult::PCKG_POLICY);
    BOOST_CHECK_EQUAL(state_conflicts.GetRejectReason(), "conflict-in-package");

    // IsConsistentPackage only cares about conflicts between transactions, not about a transaction
    // conflicting with itself (i.e. duplicate prevouts in vin).
    CMutableTransaction dup_tx;
    const COutPoint rand_prevout{Txid::FromUint256(m_rng.rand256()), 0};
    dup_tx.vin.emplace_back(rand_prevout);
    dup_tx.vin.emplace_back(rand_prevout);
    Package package_with_dup_tx{MakeTransactionRef(dup_tx)};
    BOOST_CHECK(IsConsistentPackage(package_with_dup_tx));
    package_with_dup_tx.emplace_back(create_placeholder_tx(1, 1));
    BOOST_CHECK(IsConsistentPackage(package_with_dup_tx));
}